

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::GeneratorsForTest::~GeneratorsForTest(GeneratorsForTest *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  (this->super_IGeneratorsForTest)._vptr_IGeneratorsForTest =
       (_func_int **)&PTR__GeneratorsForTest_00183398;
  ppIVar1 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->m_generatorsInOrder).
                 super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IGeneratorInfo *)0x0) {
      (*(*ppIVar2)->_vptr_IGeneratorInfo[1])();
    }
  }
  ppIVar2 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
  ::~_Rb_tree(&(this->m_generatorsByName)._M_t);
  return;
}

Assistant:

~GeneratorsForTest() {
            deleteAll( m_generatorsInOrder );
        }